

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread_test.c
# Opt level: O3

void mutex_performance_test_once(void)

{
  pthread_mutexattr_t attr;
  pthread_mutex_t mutex;
  pthread_mutexattr_t local_3c;
  pthread_mutex_t local_38;
  
  pthread_mutexattr_init(&local_3c);
  pthread_mutexattr_settype(&local_3c,1);
  pthread_mutex_init(&local_38,&local_3c);
  pthread_mutexattr_destroy(&local_3c);
  pthread_mutex_lock(&local_38);
  pthread_mutex_unlock(&local_38);
  pthread_mutex_lock(&local_38);
  pthread_mutex_unlock(&local_38);
  pthread_mutex_lock(&local_38);
  pthread_mutex_unlock(&local_38);
  pthread_mutex_lock(&local_38);
  pthread_mutex_unlock(&local_38);
  pthread_mutex_destroy(&local_38);
  return;
}

Assistant:

void mutex_performance_test_once(void)
{
    pthread_mutexattr_t attr;
    pthread_mutex_t mutex;

    pthread_mutexattr_init(&attr);
    pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);

    pthread_mutex_init(&mutex, &attr);
    pthread_mutexattr_destroy(&attr);

    pthread_mutex_lock(&mutex);
    pthread_mutex_unlock(&mutex);

    pthread_mutex_lock(&mutex);
    pthread_mutex_unlock(&mutex);

    pthread_mutex_lock(&mutex);
    pthread_mutex_unlock(&mutex);

    pthread_mutex_lock(&mutex);
    pthread_mutex_unlock(&mutex);

    pthread_mutex_destroy(&mutex);
}